

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitvector_tests.cpp
# Opt level: O2

void bsim::print_float_bits(float f)

{
  bsim *in_RSI;
  string sStack_28;
  
  float_bit_string_abi_cxx11_(&sStack_28,in_RSI,f);
  std::operator<<((ostream *)&std::cout,(string *)&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  std::operator<<((ostream *)&std::cout,'\n');
  return;
}

Assistant:

void print_float_bits(float f) {
    cout << float_bit_string(f);

    std::cout << '\n';
  }